

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_event.cpp
# Opt level: O0

void __thiscall cppnet::TimerEvent::OnTimer(TimerEvent *this)

{
  uint16_t uVar1;
  void *__args;
  element_type *peVar2;
  SingletonLogger *this_00;
  undefined1 local_30 [8];
  shared_ptr<cppnet::RWSocket> rw_sock;
  shared_ptr<cppnet::Socket> sock;
  TimerEvent *this_local;
  
  uVar1 = Event::GetType(&this->super_Event);
  if ((uVar1 & 0x10) == 0) {
    uVar1 = Event::GetType(&this->super_Event);
    if ((uVar1 & 8) == 0) {
      this_00 = Singleton<cppnet::SingletonLogger>::Instance();
      uVar1 = Event::GetType(&this->super_Event);
      SingletonLogger::Error
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/cppnet/event/timer_event.cpp"
                 ,0x1b,"invalid timer type. type:%d",(ulong)uVar1);
    }
    else {
      Event::GetSocket((Event *)&rw_sock.
                                 super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount);
      std::dynamic_pointer_cast<cppnet::RWSocket,cppnet::Socket>
                ((shared_ptr<cppnet::Socket> *)local_30);
      peVar2 = std::__shared_ptr_access<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_30);
      (*(peVar2->super_Socket)._vptr_Socket[0xd])();
      std::shared_ptr<cppnet::RWSocket>::~shared_ptr((shared_ptr<cppnet::RWSocket> *)local_30);
      std::shared_ptr<cppnet::Socket>::~shared_ptr
                ((shared_ptr<cppnet::Socket> *)
                 &rw_sock.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
  }
  else {
    __args = Event::GetData(&this->super_Event);
    std::function<void_(void_*)>::operator()(&this->_timer_cb,__args);
  }
  return;
}

Assistant:

void TimerEvent::OnTimer() {
    if (GetType() & ET_USER_TIMER) {
        _timer_cb(GetData());

    } else if (GetType() & ET_TIMER) {
        auto sock = GetSocket();
        auto rw_sock = std::dynamic_pointer_cast<RWSocket>(sock);
        rw_sock->OnTimer();

    } else {
        LOG_ERROR("invalid timer type. type:%d", GetType());
    }
}